

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O2

void __thiscall efsw::DirWatcherGeneric::removeDirectory(DirWatcherGeneric *this,string *dir)

{
  DirWatcherGeneric *this_00;
  iterator iVar1;
  string sStack_58;
  string local_38;
  
  FileSystem::dirRemoveSlashAtEnd(dir);
  std::__cxx11::string::string((string *)&sStack_58,(string *)dir);
  FileSystem::fileNameFromPath(&local_38,&sStack_58);
  std::__cxx11::string::operator=((string *)dir,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&sStack_58);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
          ::find(&(this->Directories)._M_t,dir);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->Directories)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = *(DirWatcherGeneric **)(iVar1._M_node + 2);
    this_00->Deleted = true;
    ~DirWatcherGeneric(this_00);
    operator_delete(this_00,0xc0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
    ::erase(&(this->Directories)._M_t,(key_type *)(iVar1._M_node + 1));
  }
  return;
}

Assistant:

void DirWatcherGeneric::removeDirectory( std::string dir )
{
	FileSystem::dirRemoveSlashAtEnd( dir );
	dir = FileSystem::fileNameFromPath( dir );

	DirWatcherGeneric * dw			= NULL;
	DirWatchMap::iterator dit;

	/// Folder deleted

	/// Search the folder, it should exists
	dit = Directories.find( dir );

	if ( dit != Directories.end() )
	{
		dw = dit->second;

		/// Flag it as deleted so it fire the event for every file inside deleted
		dw->Deleted = true;

		/// Delete the DirWatcherGeneric
		efSAFE_DELETE( dw );

		/// Remove the directory from the map
		Directories.erase( dit->first );
	}
}